

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha1_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  undefined1 local_80 [8];
  SHA1_CTX context;
  uint8_t *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer._56_8_ = digest;
  sha1_Init((SHA1_CTX *)local_80);
  sha1_Update((SHA1_CTX *)local_80,data,len);
  sha1_Final((SHA1_CTX *)local_80,(sha2_byte *)context.buffer._56_8_);
  return;
}

Assistant:

void sha1_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA1_DIGEST_LENGTH]) {
    trezor::SHA1_CTX	context;
	sha1_Init(&context);
	sha1_Update(&context, data, len);
	sha1_Final(&context, digest);
}